

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Transaction::GetTotalSize(Transaction *this)

{
  wally_tx *tx;
  void *pvVar1;
  int iVar2;
  uint uVar3;
  CfdException *this_00;
  uint32_t flags;
  allocator aStack_45;
  int iStack_44;
  size_t sStack_40;
  undefined1 auStack_38 [32];
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((*(long *)((long)pvVar1 + 0x10) == 0) && (*(long *)((long)pvVar1 + 0x28) == 0)) {
    return 10;
  }
  sStack_40 = 0;
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  iVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])();
  flags = 0;
  if ((char)iVar2 != '\0') {
    uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
    flags = uVar3 & 1;
  }
  iStack_44 = wally_tx_get_length(tx,flags,&sStack_40);
  if (iStack_44 == 0) {
    return (uint32_t)sStack_40;
  }
  auStack_38._0_8_ = "cfdcore_transaction_common.cpp";
  auStack_38._8_4_ = 0x23c;
  auStack_38._16_8_ = "GetTotalSize";
  logger::warn<int&>((CfdSourceLocation *)auStack_38,"wally_tx_get_length NG[{}].",&iStack_44);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)auStack_38,"transaction size calc error.",&aStack_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)auStack_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::GetTotalSize() const {
  size_t length = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // If both input / output are 0, libwally misidentifies as ElementsTransaction
  if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0)) {
    length = static_cast<size_t>(kTransactionMinimumSize);
  } else {
    length = AbstractTransaction::GetTotalSize();
  }
  return static_cast<uint32_t>(length);
}